

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternGeneration.cpp
# Opt level: O3

PatternGeneration * __thiscall
PatternGeneration::getPerlinNoiseTexture
          (PatternGeneration *this,int *imageSize,bool *random_colors,double *z1,double *z2,
          double *z3)

{
  size_t *this_00;
  element_type *peVar1;
  int i;
  uint uVar2;
  int iVar3;
  result_type rVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  Scalar_ *pSVar9;
  long lVar10;
  double dVar11;
  double *in_stack_00000008;
  undefined1 auStack_27d8 [8];
  random_device rd;
  mt19937 mt;
  PerlinNoise pn;
  Vec<unsigned_char,_3> v;
  double local_78;
  PatternGeneration *pPStack_70;
  double local_68;
  bool *local_58;
  int *local_50;
  double local_48;
  double local_40;
  double local_38;
  
  pSVar9 = (Scalar_ *)auStack_27d8;
  rd.field_0.field_0._M_func = (_func_result_type_void_ptr *)0x0;
  rd.field_0._M_mt._M_x[2] = 0;
  auStack_27d8 = (undefined1  [8])0x0;
  rd.field_0.field_0._M_file = (void *)0x0;
  local_58 = random_colors;
  local_50 = imageSize;
  cv::Mat::Mat((Mat *)this,*(int *)random_colors,*(int *)random_colors,0x10,pSVar9);
  PerlinNoise::PerlinNoise((PerlinNoise *)&mt._M_p);
  std::random_device::random_device((random_device *)auStack_27d8);
  uVar2 = std::random_device::_M_getval();
  iVar8 = (int)pSVar9;
  rd.field_0._M_mt._M_p = (size_t)uVar2;
  lVar7 = 1;
  uVar5 = rd.field_0._M_mt._M_p;
  do {
    uVar5 = (ulong)(((uint)(uVar5 >> 0x1e) ^ (uint)uVar5) * 0x6c078965 + (int)lVar7);
    mt._M_x[lVar7 + -1] = uVar5;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0x270);
  mt._M_x[0x26f] = 0x270;
  iVar3 = *(int *)local_58;
  if (0 < iVar3) {
    this_00 = &mt._M_p;
    lVar7 = 0;
    do {
      if (iVar3 < 1) {
        lVar6 = (long)iVar3;
      }
      else {
        lVar10 = 0;
        do {
          local_40 = (double)(int)lVar10 / (double)iVar3;
          local_48 = (double)(int)lVar7 / (double)iVar3;
          local_78 = 0.0;
          pPStack_70 = (PatternGeneration *)0x0;
          if (*(char *)z1 == '\x01') {
            rVar4 = std::uniform_int_distribution<int>::operator()
                              (*(uniform_int_distribution<int> **)local_50,
                               (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                                *)((long)&rd.field_0 + 0x1380),
                               &(*(uniform_int_distribution<int> **)local_50)->_M_param);
            local_38 = PerlinNoise::noise((PerlinNoise *)this_00,local_40,local_48,
                                          (double)rVar4 / 2147483647.0);
            local_38 = local_38 * 20.0;
            dVar11 = floor(local_38);
            local_78 = floor((local_38 - dVar11) * 255.0);
            rVar4 = std::uniform_int_distribution<int>::operator()
                              (*(uniform_int_distribution<int> **)local_50,
                               (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                                *)((long)&rd.field_0 + 0x1380),
                               &(*(uniform_int_distribution<int> **)local_50)->_M_param);
            local_38 = PerlinNoise::noise((PerlinNoise *)this_00,local_40,local_48,
                                          (double)rVar4 / 2147483647.0);
            local_38 = local_38 * 20.0;
            dVar11 = floor(local_38);
            pPStack_70 = (PatternGeneration *)floor((local_38 - dVar11) * 255.0);
            rVar4 = std::uniform_int_distribution<int>::operator()
                              (*(uniform_int_distribution<int> **)local_50,
                               (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                                *)((long)&rd.field_0 + 0x1380),
                               &(*(uniform_int_distribution<int> **)local_50)->_M_param);
            dVar11 = (double)rVar4 / 2147483647.0;
          }
          else {
            local_38 = PerlinNoise::noise((PerlinNoise *)this_00,local_40,local_48,*z2);
            local_38 = local_38 * 20.0;
            dVar11 = floor(local_38);
            local_78 = floor((local_38 - dVar11) * 255.0);
            local_38 = PerlinNoise::noise((PerlinNoise *)this_00,local_40,local_48,*z3);
            local_38 = local_38 * 20.0;
            dVar11 = floor(local_38);
            pPStack_70 = (PatternGeneration *)floor((local_38 - dVar11) * 255.0);
            dVar11 = *in_stack_00000008;
          }
          local_40 = PerlinNoise::noise((PerlinNoise *)this_00,local_40,local_48,dVar11);
          local_40 = local_40 * 20.0;
          dVar11 = floor(local_40);
          local_68 = floor((local_40 - dVar11) * 255.0);
          pn.p.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._0_4_ =
               (uint)pn.p.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage & 0xff000000;
          lVar6 = 0;
          do {
            iVar8 = (int)ROUND((&local_78)[lVar6]);
            if ((int)ROUND((&local_78)[lVar6]) < 1) {
              iVar8 = 0;
            }
            if (0xfe < iVar8) {
              iVar8 = 0xff;
            }
            v.super_Matx<unsigned_char,_3,_1>.val[lVar6 + -8] = (uchar)iVar8;
            lVar6 = lVar6 + 1;
          } while (lVar6 != 3);
          lVar6 = (long)(this[4].dist.
                         super___shared_ptr<std::uniform_int_distribution<int>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi)->_vptr__Sp_counted_base * lVar7;
          peVar1 = this[1].dist.
                   super___shared_ptr<std::uniform_int_distribution<int>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
          *(undefined1 *)((long)&(peVar1->_M_param)._M_a + lVar10 * 3 + lVar6 + 2) =
               pn.p.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_end_of_storage._2_1_;
          *(undefined2 *)((long)&(peVar1->_M_param)._M_a + lVar10 * 3 + lVar6) =
               pn.p.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_end_of_storage._0_2_;
          lVar10 = lVar10 + 1;
          iVar3 = *(int *)local_58;
          lVar6 = (long)iVar3;
        } while (lVar10 < lVar6);
      }
      iVar8 = (int)pSVar9;
      lVar7 = lVar7 + 1;
    } while (lVar7 < lVar6);
  }
  local_68 = 0.0;
  local_78 = (double)CONCAT44(local_78._4_4_,0x1010000);
  pn.p.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = 0x2010000;
  pPStack_70 = this;
  cv::cvtColor((cv *)&local_78,
               (_InputArray *)
               &pn.p.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage,(_OutputArray *)0x39,0,iVar8);
  std::random_device::_M_fini();
  if (mt._M_p != 0) {
    operator_delete((void *)mt._M_p);
  }
  return this;
}

Assistant:

cv::Mat PatternGeneration::getPerlinNoiseTexture(
    const int & imageSize,
    const bool & random_colors,
    const double & z1,
    const double & z2,
    const double & z3)
{
    // Create an empty PPM image
    cv::Mat image(imageSize,imageSize,CV_8UC3,cv::Scalar::all(0));
    // Create a PerlinNoise object with a random permutation vector generated with seed
    //unsigned int seed = (*dist)(mt);
    PerlinNoise pn;

    std::random_device rd;
    std::mt19937 mt(rd());

    // Visit every pixel of the image and assign a color generated with Perlin noise
    #pragma omp parallel for
    for (int i = 0; i < imageSize; ++i) {      // y
        for (int j = 0; j < imageSize; ++j) {  // x

            double x = (double)j/((double)imageSize);
            double y = (double)i/((double)imageSize);

            cv::Vec3d val;

            // Wood like structure
            if(random_colors)
            {
                // Red
                val[0] = 20.0 * pn.noise(x, y, ((double) (*dist)(mt) / (RAND_MAX)));
                val[0] = val[0] - floor(val[0]);
                val[0] = floor(255 * val[0]);
                // Green
                val[1] = 20.0 * pn.noise(x, y, ((double) (*dist)(mt) / (RAND_MAX)));
                val[1] = val[1] - floor(val[1]);
                val[1] = floor(255 * val[1]);
                // Blue
                val[2] = 20.0 * pn.noise(x, y, ((double) (*dist)(mt) / (RAND_MAX)));
                val[2] = val[2] - floor(val[2]);
                val[2] = floor(255 * val[2]);

            } else {

                // Red
                val[0] = 20.0 * pn.noise(x, y, z1);
                val[0] = val[0] - floor(val[0]);
                val[0] = floor(255 * val[0]);
                // Green
                val[1] = 20.0 * pn.noise(x, y, z2);
                val[1] = val[1] - floor(val[1]);
                val[1] = floor(255 * val[1]);
                // Blue
                val[2] = 20.0 * pn.noise(x, y, z3);
                val[2] = val[2] - floor(val[2]);
                val[2] = floor(255 * val[2]);

            }
            image.at<cv::Vec3b>(i,j) = val;
        }
    }
    cvtColor(image,image,cv::COLOR_Lab2RGB); // converting back to 8U with scaling
    return image;
}